

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:971:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:971:17)>
             *this)

{
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *this_00;
  Disposer *pDVar1;
  PromiseFulfiller<void> *pPVar2;
  MutexGuarded<bool> *this_01;
  ReducePromises<void> RVar3;
  undefined4 uVar4;
  CrossThreadPromiseFulfiller<void> *pCVar5;
  undefined4 uVar6;
  Executor *this_02;
  PromiseCrossThreadFulfillerPair<void> paf;
  PredicateImpl_conflict2 impl;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_1c9;
  PromiseCrossThreadFulfillerPair<void> local_1c8;
  undefined **local_1b0;
  undefined1 *local_1a8;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *local_1a0;
  undefined1 local_198;
  EventLoop local_188;
  UnixEventPort local_110;
  
  UnixEventPort::UnixEventPort(&local_110);
  EventLoop::EventLoop(&local_188,&local_110.super_EventPort);
  EventLoop::enterScope(&local_188);
  this_02 = getCurrentThreadExecutor();
  Executor::newPromiseAndCrossThreadFulfiller<void>(&local_1c8,this_02);
  this_00 = (this->f).fulfillerMutex;
  local_1b0 = (undefined **)((ulong)local_1b0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_00->mutex,0);
  uVar4 = local_1c8.fulfiller.ptr._0_4_;
  uVar6 = local_1c8.fulfiller.ptr._4_4_;
  local_1c8.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
  pDVar1 = (this_00->value).ptr.disposer;
  pPVar2 = (this_00->value).ptr.ptr;
  *(undefined4 *)&(this_00->value).ptr.disposer = local_1c8.fulfiller.disposer._0_4_;
  *(undefined4 *)((long)&(this_00->value).ptr.disposer + 4) = local_1c8.fulfiller.disposer._4_4_;
  *(undefined4 *)&(this_00->value).ptr.ptr = uVar4;
  *(undefined4 *)((long)&(this_00->value).ptr.ptr + 4) = uVar6;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector);
  }
  local_1a0 = &this_00->value;
  local_1b0 = &PTR_check_006312c8;
  local_198 = 0;
  local_1a8 = &local_1c9;
  kj::_::Mutex::wait(&this_00->mutex,&local_1b0);
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  RVar3.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_1c8.promise;
  local_1c8.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  if (RVar3.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)RVar3.super_PromiseBase.node.ptr);
  }
  this_01 = (this->f).done;
  local_1b0 = (undefined **)((ulong)local_1b0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&this_01->mutex,0);
  local_1a0 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)&this_01->value;
  local_1b0 = &PTR_check_006312f8;
  local_198 = 0;
  local_1a8 = &local_1c9;
  kj::_::Mutex::wait(&this_01->mutex,&local_1b0);
  kj::_::Mutex::unlock(&this_01->mutex,EXCLUSIVE,(Waiter *)0x0);
  pCVar5 = local_1c8.fulfiller.ptr;
  if (local_1c8.fulfiller.ptr != (CrossThreadPromiseFulfiller<void> *)0x0) {
    local_1c8.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_1c8.fulfiller.disposer._4_4_,local_1c8.fulfiller.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_1c8.fulfiller.disposer._4_4_,local_1c8.fulfiller.disposer._0_4_),
               (pCVar5->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector
               [-2] + (long)&(pCVar5->super_PromiseFulfiller<void>).super_PromiseRejector.
                             _vptr_PromiseRejector);
  }
  RVar3.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_1c8.promise;
  if (local_1c8.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_1c8.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)RVar3.super_PromiseBase.node.ptr);
  }
  EventLoop::leaveScope(&local_188);
  EventLoop::~EventLoop(&local_188);
  UnixEventPort::~UnixEventPort(&local_110);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }